

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O3

void idle_cb(uv_idle_t *handle)

{
  int iVar1;
  int in_ESI;
  uv_idle_t *puVar2;
  uv_udp_send_t *handle_00;
  
  if (send_req.handle == (uv_udp_t *)0x0) {
    handle_00 = (uv_udp_send_t *)handle;
    if (handle != &idle_handle) goto LAB_001882c0;
    puVar2 = &idle_handle;
    iVar1 = uv_idle_stop(&idle_handle);
    handle_00 = (uv_udp_send_t *)puVar2;
    if (iVar1 != 0) goto LAB_001882c5;
    if (999 < loop_hang_called) {
      loop_hang_called = loop_hang_called + 1;
      uv_close((uv_handle_t *)&client,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&idle_handle,(uv_close_cb)0x0);
      return;
    }
    handle_00 = &send_req;
    in_ESI = 0x5b9b58;
    loop_hang_called = loop_hang_called + 1;
    iVar1 = uv_udp_send(&send_req,&client,&buf,1,(sockaddr *)&addr,send_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    handle_00 = (uv_udp_send_t *)send_req.handle;
    idle_cb_cold_1();
LAB_001882c0:
    idle_cb_cold_2();
LAB_001882c5:
    idle_cb_cold_3();
  }
  idle_cb_cold_4();
  if (handle_00 == (uv_udp_send_t *)0x0) {
    send_cb_cold_5();
    puVar2 = (uv_idle_t *)handle_00;
LAB_0018831d:
    send_cb_cold_1();
LAB_00188322:
    send_cb_cold_2();
  }
  else {
    if ((in_ESI != -0x65) && (in_ESI != 0)) goto LAB_0018832c;
    puVar2 = (uv_idle_t *)handle_00;
    if (handle_00->handle != &client) goto LAB_0018831d;
    if (handle_00 != &send_req) goto LAB_00188322;
    send_req.handle = (uv_udp_t *)0x0;
    puVar2 = &idle_handle;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  send_cb_cold_3();
  handle_00 = (uv_udp_send_t *)puVar2;
LAB_0018832c:
  send_cb_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)handle_00);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
  return;
}

Assistant:

static void idle_cb(uv_idle_t* idle) {
  uv_sleep(100);
  if (++ticks < kMaxTicks)
    return;

  uv_poll_stop(&poll_req[0]);
  uv_poll_stop(&poll_req[1]);
  uv_close((uv_handle_t*) &server_handle, NULL);
  uv_close((uv_handle_t*) &client_handle, NULL);
  uv_close((uv_handle_t*) &peer_handle, NULL);
  uv_close((uv_handle_t*) idle, NULL);
}